

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

ZSTD_compressionParameters *
ZSTD_adjustCParams_internal
          (ZSTD_compressionParameters *__return_storage_ptr__,ZSTD_compressionParameters cPar,
          unsigned_long_long srcSize,size_t dictSize)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ZSTD_compressionParameters ZVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  
  ZVar3 = cPar;
  uVar4 = -(ulong)(srcSize == 0) | srcSize;
  uVar6 = 0x201;
  if (1 < srcSize + 1) {
    uVar6 = uVar4;
  }
  if (dictSize == 0) {
    uVar6 = uVar4;
  }
  if ((uVar6 | dictSize) < 0x40000000) {
    uVar5 = (int)(uVar6 + dictSize) - 1;
    uVar7 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar5 = 6;
    if (0x3f < uVar6 + dictSize) {
      uVar5 = (uVar7 ^ 0xffffffe0) + 0x21;
    }
    if (uVar5 < cPar.windowLog) {
      cPar.windowLog = uVar5;
    }
  }
  if (cPar.windowLog + 1 < cPar.hashLog) {
    cPar.hashLog = cPar.windowLog + 1;
  }
  uVar7 = (cPar.chainLog - 1) + (uint)(cPar.strategy < ZSTD_btlazy2);
  if (cPar.windowLog < uVar7) {
    cPar.chainLog = (cPar.chainLog + cPar.windowLog) - uVar7;
  }
  if (cPar.windowLog < 10) {
    cPar.windowLog = 10;
  }
  uVar1 = ZVar3._12_8_;
  uVar2 = ZVar3._20_8_;
  __return_storage_ptr__->searchLog = (int)uVar1;
  __return_storage_ptr__->minMatch = (int)((ulong)uVar1 >> 0x20);
  __return_storage_ptr__->targetLength = (int)uVar2;
  __return_storage_ptr__->strategy = (int)((ulong)uVar2 >> 0x20);
  __return_storage_ptr__->windowLog = cPar.windowLog;
  __return_storage_ptr__->chainLog = cPar.chainLog;
  __return_storage_ptr__->hashLog = cPar.hashLog;
  __return_storage_ptr__->searchLog = cPar.searchLog;
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_compressionParameters
ZSTD_adjustCParams_internal(ZSTD_compressionParameters cPar,
                            unsigned long long srcSize,
                            size_t dictSize)
{
    static const U64 minSrcSize = 513; /* (1<<9) + 1 */
    static const U64 maxWindowResize = 1ULL << (ZSTD_WINDOWLOG_MAX-1);
    assert(ZSTD_checkCParams(cPar)==0);

    if (dictSize && (srcSize+1<2) /* srcSize unknown */ )
        srcSize = minSrcSize;  /* presumed small when there is a dictionary */
    else if (srcSize == 0)
        srcSize = ZSTD_CONTENTSIZE_UNKNOWN;  /* 0 == unknown : presumed large */

    /* resize windowLog if input is small enough, to use less memory */
    if ( (srcSize < maxWindowResize)
      && (dictSize < maxWindowResize) )  {
        U32 const tSize = (U32)(srcSize + dictSize);
        static U32 const hashSizeMin = 1 << ZSTD_HASHLOG_MIN;
        U32 const srcLog = (tSize < hashSizeMin) ? ZSTD_HASHLOG_MIN :
                            ZSTD_highbit32(tSize-1) + 1;
        if (cPar.windowLog > srcLog) cPar.windowLog = srcLog;
    }
    if (cPar.hashLog > cPar.windowLog+1) cPar.hashLog = cPar.windowLog+1;
    {   U32 const cycleLog = ZSTD_cycleLog(cPar.chainLog, cPar.strategy);
        if (cycleLog > cPar.windowLog)
            cPar.chainLog -= (cycleLog - cPar.windowLog);
    }

    if (cPar.windowLog < ZSTD_WINDOWLOG_ABSOLUTEMIN)
        cPar.windowLog = ZSTD_WINDOWLOG_ABSOLUTEMIN;  /* required for frame header */

    return cPar;
}